

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O3

void __thiscall
NativeEntryPointData::ClearTypeRefsAndGuards
          (NativeEntryPointData *this,ScriptContext *scriptContext)

{
  EntryPointInfo **entryPoint;
  
  (this->runtimeTypeRefs).ptr = (WriteBarrierPtr<void> *)0x0;
  FreePropertyGuards(this);
  this->equivalentTypeCacheCount = 0;
  (this->equivalentTypeCaches).ptr = (EquivalentTypeCache *)0x0;
  entryPoint = (this->registeredEquivalentTypeCacheRef).ptr;
  if (entryPoint != (EntryPointInfo **)0x0) {
    if (scriptContext != (ScriptContext *)0x0) {
      ThreadContext::UnregisterEquivalentTypeCacheEntryPoint
                (scriptContext->threadContext,entryPoint);
    }
    (this->registeredEquivalentTypeCacheRef).ptr = (EntryPointInfo **)0x0;
  }
  return;
}

Assistant:

void 
NativeEntryPointData::ClearTypeRefsAndGuards(ScriptContext * scriptContext)
{
    this->runtimeTypeRefs = nullptr;
    this->FreePropertyGuards();
    this->equivalentTypeCacheCount = 0;
    this->equivalentTypeCaches = nullptr;
    this->UnregisterEquivalentTypeCaches(scriptContext);
}